

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O2

void __thiscall UKF::Prediction(UKF *this,double delta_t)

{
  MatrixXd *this_00;
  VectorXd *this_01;
  MatrixXd *other;
  VectorXd *other_00;
  double dVar1;
  double dVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  int i;
  long lVar12;
  int i_1;
  long lVar13;
  int *piVar14;
  ulong uVar15;
  int i_2;
  double dVar16;
  double dVar17;
  undefined1 local_248 [48];
  VectorXd x_aug;
  undefined1 local_1f8 [24];
  Nested local_1e0;
  Nested pMStack_1d8;
  RhsNested local_1d0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>
  local_1b8;
  double local_190;
  VectorXd x_diff;
  MatrixXd P_aug;
  MatrixXd Xsig_aug;
  MatrixXd Xsig;
  MatrixXd L;
  MatrixXd A;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> local_58 [40];
  
  piVar14 = &this->n_x_;
  local_1f8._0_4_ = this->n_x_ * 2 + 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&Xsig,piVar14,(int *)local_1f8);
  other = &this->P_;
  Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1f8,other);
  local_1b8.m_lhs =
       (LhsNested)
       Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                 ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1f8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&A,
             (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
              *)&local_1b8);
  free((void *)local_1f8._0_8_);
  this->lambda_ = (double)(3 - this->n_x_);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1f8,&Xsig,0);
  other_00 = &this->x_;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::
  lazyAssign<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)local_1f8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other_00);
  lVar13 = 0;
  while (lVar13 < *piVar14) {
    dVar7 = (double)*piVar14 + this->lambda_;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&x_diff,&A,lVar13);
    local_1b8.m_lhs =
         (LhsNested)
         x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_1b8.m_rhs =
         (RhsNested)
         x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_190 = dVar7;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)local_1f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)other_00,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_1b8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_58,&Xsig,
               lVar13 + 1);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
              (local_58,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                         *)local_1f8);
    dVar7 = (double)this->n_x_ + this->lambda_;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&x_diff,&A,lVar13);
    local_1b8.m_lhs =
         (LhsNested)
         x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_1b8.m_rhs =
         (RhsNested)
         x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_190 = dVar7;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)local_1f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)other_00,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_1b8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_58,&Xsig,
               (long)(*piVar14 + (int)lVar13 + 1));
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
              (local_58,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                         *)local_1f8);
    lVar13 = lVar13 + 1;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&x_aug,(long)this->n_aug_);
  piVar14 = &this->n_aug_;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&P_aug,piVar14,piVar14);
  local_1f8._0_4_ = *piVar14 * 2 + 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&Xsig_aug,piVar14,(int *)local_1f8);
  this->lambda_ = (double)(3 - this->n_aug_);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head
            ((SegmentReturnType *)local_1f8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x_aug,5);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::
  lazyAssign<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)local_1f8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other_00);
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x_aug,5);
  *pSVar10 = 0.0;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x_aug,6);
  *pSVar10 = 0.0;
  local_1f8._0_8_ = (LhsNested)0x0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&P_aug,(Scalar *)local_1f8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::topLeftCorner
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1f8,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&P_aug,5,5);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
  lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)local_1f8,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other);
  dVar7 = this->std_a_;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&P_aug,5,5);
  *pSVar11 = dVar7 * dVar7;
  dVar7 = this->std_yawdd_;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&P_aug,6,6);
  *pSVar11 = dVar7 * dVar7;
  Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1f8,&P_aug);
  local_1b8.m_lhs =
       (LhsNested)
       Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                 ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1f8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&L,
             (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
              *)&local_1b8);
  free((void *)local_1f8._0_8_);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1f8,&Xsig_aug,0);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::
  lazyAssign<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)local_1f8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x_aug);
  lVar13 = 0;
  while( true ) {
    uVar15 = (ulong)*piVar14;
    if ((long)uVar15 <= lVar13) break;
    dVar7 = (double)*piVar14 + this->lambda_;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&x_diff,&L,lVar13);
    local_1b8.m_lhs =
         (LhsNested)
         x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_1b8.m_rhs =
         (RhsNested)
         x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_190 = dVar7;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)local_1f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x_aug,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_1b8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_58,&Xsig_aug,
               lVar13 + 1);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
              (local_58,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                         *)local_1f8);
    dVar7 = (double)this->n_aug_ + this->lambda_;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&x_diff,&L,lVar13);
    local_1b8.m_lhs =
         (LhsNested)
         x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_1b8.m_rhs =
         (RhsNested)
         x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_190 = dVar7;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)local_1f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x_aug,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_1b8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_58,&Xsig_aug,
               (long)(*piVar14 + (int)lVar13 + 1));
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
              (local_58,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                         *)local_1f8);
    lVar13 = lVar13 + 1;
  }
  this_00 = &this->Xsig_pred_;
  lVar13 = 1;
  for (lVar12 = 0; lVar12 <= (int)uVar15 * 2; lVar12 = lVar12 + 1) {
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&Xsig_aug,0
                         ,lVar12);
    dVar7 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&Xsig_aug,1
                         ,lVar12);
    dVar1 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&Xsig_aug,2
                         ,lVar12);
    dVar2 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&Xsig_aug,3
                         ,lVar12);
    __x = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&Xsig_aug,4
                         ,lVar12);
    dVar3 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&Xsig_aug,5
                         ,lVar12);
    dVar4 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&Xsig_aug,6
                         ,lVar12);
    dVar5 = *pSVar11;
    if (ABS(dVar3) <= 0.001) {
      dVar17 = cos(__x);
      dVar8 = sin(__x);
      dVar1 = dVar1 + dVar8 * dVar2 * delta_t;
      local_248._8_4_ = SUB84(dVar1,0);
      local_248._0_8_ = dVar7 + dVar17 * dVar2 * delta_t;
      local_248._12_4_ = (int)((ulong)dVar1 >> 0x20);
    }
    else {
      dVar16 = dVar3 * delta_t + __x;
      dVar17 = sin(dVar16);
      dVar8 = sin(__x);
      dVar9 = cos(__x);
      dVar16 = cos(dVar16);
      dVar1 = dVar1 + (dVar2 / dVar3) * (dVar9 - dVar16);
      local_248._8_4_ = SUB84(dVar1,0);
      local_248._0_8_ = dVar7 + (dVar2 / dVar3) * (dVar17 - dVar8);
      local_248._12_4_ = (int)((ulong)dVar1 >> 0x20);
    }
    dVar7 = cos(__x);
    dVar1 = sin(__x);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,0,
                         lVar12);
    dVar17 = dVar4 * 0.5 * delta_t * delta_t;
    *pSVar11 = dVar7 * dVar17 + (double)local_248._0_8_;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,1,
                         lVar12);
    *pSVar11 = dVar17 * dVar1 + (double)local_248._8_8_;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,2,
                         lVar12);
    *pSVar11 = dVar4 * delta_t + dVar2;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,3,
                         lVar12);
    *pSVar11 = dVar5 * 0.5 * delta_t * delta_t + dVar3 * delta_t + __x;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,4,
                         lVar12);
    *pSVar11 = dVar5 * delta_t + dVar3;
    uVar15 = (ulong)(uint)*piVar14;
  }
  dVar7 = this->lambda_;
  this_01 = &this->weights_;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,0);
  *pSVar10 = dVar7 / ((double)(int)uVar15 + dVar7);
  for (; iVar6 = *piVar14, lVar12 = (long)iVar6 * 2,
      lVar13 == lVar12 || SBORROW8(lVar13,lVar12) != lVar13 + (long)iVar6 * -2 < 0;
      lVar13 = lVar13 + 1) {
    dVar7 = this->lambda_;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,
                         lVar13);
    *pSVar10 = 0.5 / (dVar7 + (double)iVar6);
  }
  local_1f8._0_8_ = (LhsNested)0x0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other_00,(Scalar *)local_1f8);
  for (lVar13 = 0; lVar12 = (long)*piVar14 * 2,
      lVar13 == lVar12 || SBORROW8(lVar13,lVar12) != lVar13 + (long)*piVar14 * -2 < 0;
      lVar13 = lVar13 + 1) {
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,
                         lVar13);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&x_diff,this_00,
               lVar13);
    local_190 = *pSVar10;
    local_1b8.m_lhs =
         (LhsNested)
         x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_1b8.m_rhs =
         (RhsNested)
         x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)local_1f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)other_00,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_1b8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)other_00,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                *)local_1f8);
  }
  local_1f8._0_8_ = (Matrix<double,_1,1,0,_1,1> *)0x0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other,(Scalar *)local_1f8);
  for (lVar13 = 0; lVar12 = (long)*piVar14 * 2,
      lVar13 == lVar12 || SBORROW8(lVar13,lVar12) != lVar13 + (long)*piVar14 * -2 < 0;
      lVar13 = lVar13 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_1b8,this_00,
               lVar13);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)local_1f8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)&local_1b8
               ,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other_00);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,_1,1,0,_1,1> *)&x_diff,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_1f8);
    while( true ) {
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x_diff,3);
      if (*pSVar10 <= 3.141592653589793) break;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x_diff,3);
      *pSVar10 = *pSVar10 + -6.283185307179586;
    }
    while( true ) {
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x_diff,3);
      if (-3.141592653589793 < *pSVar10 || *pSVar10 == -3.141592653589793) break;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x_diff,3);
      *pSVar10 = *pSVar10 + 6.283185307179586;
    }
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,
                         lVar13);
    local_1f8._8_8_ = *pSVar10;
    local_1e0 = (Nested)0x0;
    pMStack_1d8 = (Nested)0x0;
    local_1d0 = (RhsNested)0x0;
    local_1f8._0_8_ = (Matrix<double,_1,1,0,_1,1> *)&x_diff;
    local_1f8._16_8_ = (Matrix<double,_1,1,0,_1,1> *)&x_diff;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
              (&local_1b8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)other,
               (MatrixBase<Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>
                *)local_1f8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)other,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                *)&local_1b8);
    free(local_1e0);
    free(x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  free(L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(Xsig_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(P_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(x_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(Xsig.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void UKF::Prediction(double delta_t) {
  /**
  TODO:

  Complete this function! Estimate the object's location. Modify the state
  vector, x_. Predict sigma points, the state, and the state covariance matrix.
  */

  /*****************************************************************************
  *  Generate Sigma Points
  ****************************************************************************/
  //create sigma point matrix
  MatrixXd Xsig = MatrixXd(n_x_, 2 * n_x_ + 1);

  //calculate square root of P
  MatrixXd A = P_.llt().matrixL();

  //set lambda for non-augmented sigma points
  lambda_ = 3 - n_x_;

  //set first column of sigma point matrix
  Xsig.col(0) = x_;

  //set remaining sigma points
  for (int i = 0; i < n_x_; i++)
  {
    Xsig.col(i + 1) = x_ + sqrt(lambda_ + n_x_) * A.col(i);
    Xsig.col(i + 1 + n_x_) = x_ - sqrt(lambda_ + n_x_) * A.col(i);
  }

  /*****************************************************************************
  *  Augment Sigma Points
  ****************************************************************************/
  //create augmented mean vector
  VectorXd x_aug = VectorXd(n_aug_);

  //create augmented state covariance
  MatrixXd P_aug = MatrixXd(n_aug_, n_aug_);

  //create sigma point matrix
  MatrixXd Xsig_aug = MatrixXd(n_aug_, 2 * n_aug_ + 1);

  //set lambda for augmented sigma points
  lambda_ = 3 - n_aug_;

  //create augmented mean state
  x_aug.head(5) = x_;
  x_aug(5) = 0;
  x_aug(6) = 0;

  //create augmented covariance matrix
  P_aug.fill(0.0);
  P_aug.topLeftCorner(5, 5) = P_;
  P_aug(5, 5) = std_a_*std_a_;
  P_aug(6, 6) = std_yawdd_*std_yawdd_;

  //create square root matrix
  MatrixXd L = P_aug.llt().matrixL();

  //create augmented sigma points
  Xsig_aug.col(0) = x_aug;
  for (int i = 0; i< n_aug_; i++)
  {
    Xsig_aug.col(i + 1) = x_aug + sqrt(lambda_ + n_aug_) * L.col(i);
    Xsig_aug.col(i + 1 + n_aug_) = x_aug - sqrt(lambda_ + n_aug_) * L.col(i);
  }

  /*****************************************************************************
  *  Predict Sigma Points
  ****************************************************************************/
  //predict sigma points
  for (int i = 0; i < 2 * n_aug_ + 1; i++)
  {
    //extract values for better readability
    double p_x      = Xsig_aug(0, i);
    double p_y      = Xsig_aug(1, i);
    double v        = Xsig_aug(2, i);
    double yaw      = Xsig_aug(3, i);
    double yawd     = Xsig_aug(4, i);
    double nu_a     = Xsig_aug(5, i);
    double nu_yawdd = Xsig_aug(6, i);

    //predicted state values
    double px_p, py_p;

    //avoid division by zero
    if (fabs(yawd) > 0.001) {
      px_p = p_x + v / yawd * (sin(yaw + yawd * delta_t) - sin(yaw));
      py_p = p_y + v / yawd * (cos(yaw) - cos(yaw + yawd * delta_t));
    }
    else {
      px_p = p_x + v * delta_t * cos(yaw);
      py_p = p_y + v * delta_t * sin(yaw);
    }

    double v_p = v;
    double yaw_p = yaw + yawd * delta_t;
    double yawd_p = yawd;

    //add noise
    px_p = px_p + 0.5 * nu_a * delta_t * delta_t * cos(yaw);
    py_p = py_p + 0.5 * nu_a * delta_t * delta_t * sin(yaw);
    v_p = v_p + nu_a*delta_t;

    yaw_p = yaw_p + 0.5*nu_yawdd*delta_t*delta_t;
    yawd_p = yawd_p + nu_yawdd*delta_t;

    //write predicted sigma point into right column
    Xsig_pred_(0, i) = px_p;
    Xsig_pred_(1, i) = py_p;
    Xsig_pred_(2, i) = v_p;
    Xsig_pred_(3, i) = yaw_p;
    Xsig_pred_(4, i) = yawd_p;
  }

  /*****************************************************************************
  *  Convert Predicted Sigma Points to Mean/Covariance
  ****************************************************************************/

  // set weights
  double weight_0 = lambda_ / (lambda_ + n_aug_);
  weights_(0) = weight_0;
  for (int i = 1; i < 2 * n_aug_ + 1; i++) {  //2n+1 weights
    double weight = 0.5 / (n_aug_ + lambda_);
    weights_(i) = weight;
  }

  //predicted state mean
  x_.fill(0.0);             //******* necessary? *********
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points
    x_ = x_ + weights_(i) * Xsig_pred_.col(i);
  }

  //predicted state covariance matrix
  P_.fill(0.0);             //******* necessary? *********
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points

    // state difference
    VectorXd x_diff = Xsig_pred_.col(i) - x_;
    //angle normalization
    while (x_diff(3)> M_PI) x_diff(3) -= 2.*M_PI;
    while (x_diff(3)<-M_PI) x_diff(3) += 2.*M_PI;

    P_ = P_ + weights_(i) * x_diff * x_diff.transpose();
  }

}